

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O0

void btPolyhedralContactClipping::clipHullAgainstHull
               (btVector3 *separatingNormal1,btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,
               btTransform *transA,btTransform *transB,btScalar minDist,btScalar maxDist,
               Result *resultOut)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  btFace *pbVar4;
  btFace *pbVar5;
  btFace *pbVar6;
  btAlignedObjectArray<btVector3> *this;
  int *piVar7;
  long in_RDX;
  btTransform *in_R8;
  btScalar bVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar9;
  btVector3 *b;
  int e0;
  int numVertices;
  btFace *polyB;
  btVertexArray worldVertsB1;
  btScalar d;
  btVector3 WorldNormal;
  btVector3 Normal;
  int face;
  btScalar dmax;
  int closestFaceB;
  btVector3 separatingNormal;
  Result *in_stack_00000268;
  btScalar in_stack_00000270;
  btScalar in_stack_00000274;
  btVertexArray *in_stack_00000278;
  btTransform *in_stack_00000280;
  btConvexPolyhedron *in_stack_00000288;
  btVector3 *in_stack_00000290;
  undefined1 in_stack_fffffffffffffec8 [16];
  undefined1 in_stack_fffffffffffffed8 [16];
  int local_b4;
  btVector3 local_74;
  btVector3 local_64;
  int local_54;
  btScalar local_50;
  int local_4c;
  btVector3 local_48 [2];
  btTransform *local_28;
  long local_18;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  bVar9 = btVector3::normalized(in_stack_fffffffffffffed8._0_8_);
  local_48[0].m_floats._0_8_ = bVar9.m_floats._0_8_;
  local_48[0].m_floats._8_8_ = bVar9.m_floats._8_8_;
  local_4c = -1;
  local_50 = -3.4028235e+38;
  local_54 = 0;
  while( true ) {
    iVar3 = local_54;
    iVar2 = btAlignedObjectArray<btFace>::size((btAlignedObjectArray<btFace> *)(local_18 + 0x28));
    if (iVar2 <= iVar3) break;
    pbVar4 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_18 + 0x28),local_54);
    pbVar5 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_18 + 0x28),local_54);
    pbVar6 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_18 + 0x28),local_54);
    btVector3::btVector3(&local_64,pbVar4->m_plane,pbVar5->m_plane + 1,pbVar6->m_plane + 2);
    btTransform::getBasis(local_28);
    bVar9 = ::operator*(in_stack_fffffffffffffed8._8_8_,in_stack_fffffffffffffed8._0_8_);
    local_74.m_floats._0_8_ = bVar9.m_floats._0_8_;
    local_74.m_floats._8_8_ = bVar9.m_floats._8_8_;
    bVar8 = btVector3::dot(&local_74,local_48);
    if (local_50 < bVar8) {
      local_4c = local_54;
      local_50 = bVar8;
    }
    local_54 = local_54 + 1;
  }
  btAlignedObjectArray<btVector3>::btAlignedObjectArray(in_stack_fffffffffffffec8._8_8_);
  pbVar4 = btAlignedObjectArray<btFace>::operator[]
                     ((btAlignedObjectArray<btFace> *)(local_18 + 0x28),local_4c);
  iVar3 = btAlignedObjectArray<int>::size(&pbVar4->m_indices);
  for (local_b4 = 0; local_b4 < iVar3; local_b4 = local_b4 + 1) {
    this = (btAlignedObjectArray<btVector3> *)(local_18 + 8);
    piVar7 = btAlignedObjectArray<int>::operator[](&pbVar4->m_indices,local_b4);
    btAlignedObjectArray<btVector3>::operator[](this,*piVar7);
    bVar9 = btTransform::operator*(in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_);
    in_stack_fffffffffffffec8._8_4_ = in_XMM1_Dc;
    in_stack_fffffffffffffec8._0_8_ = bVar9.m_floats._8_8_;
    in_stack_fffffffffffffec8._12_4_ = in_XMM1_Dd;
    auVar1._8_4_ = extraout_XMM0_Dc;
    auVar1._0_8_ = bVar9.m_floats._0_8_;
    auVar1._12_4_ = extraout_XMM0_Dd;
    in_XMM1_Dc = extraout_XMM0_Dc;
    in_XMM1_Dd = extraout_XMM0_Dd;
    btAlignedObjectArray<btVector3>::push_back(auVar1._8_8_,bVar9.m_floats._0_8_);
  }
  if (-1 < local_4c) {
    clipFaceAgainstHull(in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278,
                        in_stack_00000274,in_stack_00000270,in_stack_00000268);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x1f3c7a);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipHullAgainstHull(const btVector3& separatingNormal1, const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{

	btVector3 separatingNormal = separatingNormal1.normalized();
//	const btVector3 c0 = transA * hullA.m_localCenter;
//	const btVector3 c1 = transB * hullB.m_localCenter;
	//const btVector3 DeltaC2 = c0 - c1;



	int closestFaceB=-1;
	btScalar dmax = -FLT_MAX;
	{
		for(int face=0;face<hullB.m_faces.size();face++)
		{
			const btVector3 Normal(hullB.m_faces[face].m_plane[0], hullB.m_faces[face].m_plane[1], hullB.m_faces[face].m_plane[2]);
			const btVector3 WorldNormal = transB.getBasis() * Normal;
			btScalar d = WorldNormal.dot(separatingNormal);
			if (d > dmax)
			{
				dmax = d;
				closestFaceB = face;
			}
		}
	}
				btVertexArray worldVertsB1;
				{
					const btFace& polyB = hullB.m_faces[closestFaceB];
					const int numVertices = polyB.m_indices.size();
					for(int e0=0;e0<numVertices;e0++)
					{
						const btVector3& b = hullB.m_vertices[polyB.m_indices[e0]];
						worldVertsB1.push_back(transB*b);
					}
				}

	
	if (closestFaceB>=0)
		clipFaceAgainstHull(separatingNormal, hullA, transA,worldVertsB1, minDist, maxDist,resultOut);

}